

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

uint __thiscall ON_FontList::AddFonts(ON_FontList *this,size_t font_count,ON_Font **font_list)

{
  uint uVar1;
  ulong local_38;
  size_t i;
  uint rc;
  ON_Font **font_list_local;
  size_t font_count_local;
  ON_FontList *this_local;
  
  if ((font_list == (ON_Font **)0x0) || (font_count == 0)) {
    this_local._4_4_ = 0;
  }
  else {
    i._4_4_ = 0;
    for (local_38 = 0; local_38 < font_count; local_38 = local_38 + 1) {
      uVar1 = AddFont(this,font_list[local_38],false);
      i._4_4_ = uVar1 + i._4_4_;
    }
    this_local._4_4_ = i._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int ON_FontList::AddFonts(
  size_t font_count,
  const ON_Font * const * font_list
)
{
  if (nullptr == font_list || font_count <= 0)
    return 0;

  unsigned int rc = 0;
  for (size_t i = 0; i < font_count; i++)
  {
    rc += AddFont(font_list[i],false);
  }
  return rc;
}